

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O0

bool __thiscall tcmalloc::PageHeap::CheckState(PageHeap *this)

{
  uint64_t uVar1;
  bool bVar2;
  Span *pSVar3;
  size_type sVar4;
  reference ppSVar5;
  _Self local_78;
  _Self local_70;
  iterator it_1;
  _Self local_60;
  iterator it;
  Span *pSStack_50;
  int count;
  Span *span_1;
  Span *span;
  int count_1;
  int i;
  uint64_t large_returned_bytes;
  uint64_t large_normal_bytes;
  uint64_t returned_bytes;
  uint64_t normal_bytes;
  lock_guard<std::mutex> guard;
  PageHeap *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&normal_bytes,&this->lock);
  if (this->release_rate_ < 0) {
    __assert_fail("0 <= release_rate_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x5c,"bool tcmalloc::PageHeap::CheckState()");
  }
  if (0x80 < this->release_index_) {
    __assert_fail("release_index_ <= 128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x5d,"bool tcmalloc::PageHeap::CheckState()");
  }
  if ((this->stat).normal_bytes + (this->stat).returned_bytes + (this->stat).in_used_bytes !=
      (this->stat).system_bytes) {
    __assert_fail("(stat.normal_bytes + stat.returned_bytes + stat.in_used_bytes) == stat.system_bytes"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x5e,"bool tcmalloc::PageHeap::CheckState()");
  }
  bVar2 = CheckSmallList(this);
  if (!bVar2) {
    __assert_fail("CheckSmallList()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x5f,"bool tcmalloc::PageHeap::CheckState()");
  }
  returned_bytes = 0;
  large_normal_bytes = 0;
  large_returned_bytes = 0;
  _count_1 = 0;
  for (span._4_4_ = 0; span._4_4_ < 0x80; span._4_4_ = span._4_4_ + 1) {
    span._0_4_ = (int)this->small_normal_size_[(int)span._4_4_];
    for (span_1 = this->small_normal_[(int)span._4_4_].next;
        span_1 != this->small_normal_ + (int)span._4_4_; span_1 = span_1->next) {
      span._0_4_ = (int)span + -1;
      if ((int)span < 0) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x6a,"bool tcmalloc::PageHeap::CheckState()");
      }
      if (span_1->location != 1) {
        __assert_fail("span->location == Span::IN_NORMAL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x6b,"bool tcmalloc::PageHeap::CheckState()");
      }
      pSVar3 = (Span *)PageMap::Get(&this->page_map_,span_1->page_id);
      if (pSVar3 != span_1) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x6c,"bool tcmalloc::PageHeap::CheckState()");
      }
      pSVar3 = (Span *)PageMap::Get(&this->page_map_,(span_1->page_id + span_1->npages) - 1);
      if (pSVar3 != span_1) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x6d,"bool tcmalloc::PageHeap::CheckState()");
      }
      returned_bytes = span_1->npages * 0x2000 + returned_bytes;
    }
    span._0_4_ = (int)this->small_returned_size_[(int)span._4_4_];
    for (pSStack_50 = this->small_returned_[(int)span._4_4_].next;
        pSStack_50 != this->small_returned_ + (int)span._4_4_; pSStack_50 = pSStack_50->next) {
      span._0_4_ = (int)span + -1;
      if ((int)span < 0) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x73,"bool tcmalloc::PageHeap::CheckState()");
      }
      if (pSStack_50->location != 2) {
        __assert_fail("span->location == Span::IN_RETURNED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x74,"bool tcmalloc::PageHeap::CheckState()");
      }
      pSVar3 = (Span *)PageMap::Get(&this->page_map_,pSStack_50->page_id);
      if (pSVar3 != pSStack_50) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x75,"bool tcmalloc::PageHeap::CheckState()");
      }
      pSVar3 = (Span *)PageMap::Get(&this->page_map_,(pSStack_50->page_id + pSStack_50->npages) - 1)
      ;
      if (pSVar3 != pSStack_50) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                      ,0x76,"bool tcmalloc::PageHeap::CheckState()");
      }
      large_normal_bytes = pSStack_50->npages * 0x2000 + large_normal_bytes;
    }
  }
  sVar4 = std::
          set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
          ::size(&this->large_normal_);
  it._M_node._4_4_ = (int)sVar4;
  local_60._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
       ::begin(&this->large_normal_);
  while( true ) {
    it_1 = std::
           set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
           ::end(&this->large_normal_);
    bVar2 = std::operator!=(&local_60,&it_1);
    if (!bVar2) break;
    it._M_node._4_4_ = it._M_node._4_4_ + -1;
    if (it._M_node._4_4_ < 0) {
      __assert_fail("count >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x7e,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    if ((*ppSVar5)->location != 1) {
      __assert_fail("(*it)->location == Span::IN_NORMAL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x7f,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    pSVar3 = (Span *)PageMap::Get(&this->page_map_,(*ppSVar5)->page_id);
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    if (pSVar3 != *ppSVar5) {
      __assert_fail("page_map_.Get((*it)->page_id) == (*it)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x80,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    uVar1 = (*ppSVar5)->page_id;
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    pSVar3 = (Span *)PageMap::Get(&this->page_map_,(uVar1 + (*ppSVar5)->npages) - 1);
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    if (pSVar3 != *ppSVar5) {
      __assert_fail("page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x81,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    returned_bytes = (*ppSVar5)->npages * 0x2000 + returned_bytes;
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_60);
    large_returned_bytes = (*ppSVar5)->npages * 0x2000 + large_returned_bytes;
    std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator++(&local_60);
  }
  sVar4 = std::
          set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
          ::size(&this->large_returned_);
  it._M_node._4_4_ = (int)sVar4;
  local_70._M_node =
       (_Base_ptr)
       std::
       set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
       ::begin(&this->large_returned_);
  while( true ) {
    local_78._M_node =
         (_Base_ptr)
         std::
         set<tcmalloc::Span_*,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
         ::end(&this->large_returned_);
    bVar2 = std::operator!=(&local_70,&local_78);
    if (!bVar2) break;
    it._M_node._4_4_ = it._M_node._4_4_ + -1;
    if (it._M_node._4_4_ < 0) {
      __assert_fail("count >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x88,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    if ((*ppSVar5)->location != 2) {
      __assert_fail("(*it)->location == Span::IN_RETURNED",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x89,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    pSVar3 = (Span *)PageMap::Get(&this->page_map_,(*ppSVar5)->page_id);
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    if (pSVar3 != *ppSVar5) {
      __assert_fail("page_map_.Get((*it)->page_id) == (*it)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x8a,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    uVar1 = (*ppSVar5)->page_id;
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    pSVar3 = (Span *)PageMap::Get(&this->page_map_,(uVar1 + (*ppSVar5)->npages) - 1);
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    if (pSVar3 != *ppSVar5) {
      __assert_fail("page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                    ,0x8b,"bool tcmalloc::PageHeap::CheckState()");
    }
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    large_normal_bytes = (*ppSVar5)->npages * 0x2000 + large_normal_bytes;
    ppSVar5 = std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator*(&local_70);
    _count_1 = (*ppSVar5)->npages * 0x2000 + _count_1;
    std::_Rb_tree_const_iterator<tcmalloc::Span_*>::operator++(&local_70);
  }
  if (large_returned_bytes != (this->stat).large_normal_bytes) {
    __assert_fail("large_normal_bytes == stat.large_normal_bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x90,"bool tcmalloc::PageHeap::CheckState()");
  }
  if (_count_1 != (this->stat).large_returned_bytes) {
    __assert_fail("large_returned_bytes == stat.large_returned_bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x91,"bool tcmalloc::PageHeap::CheckState()");
  }
  if (returned_bytes != (this->stat).normal_bytes) {
    __assert_fail("normal_bytes == stat.normal_bytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x92,"bool tcmalloc::PageHeap::CheckState()");
  }
  if (large_normal_bytes == (this->stat).returned_bytes) {
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&normal_bytes);
    return true;
  }
  __assert_fail("returned_bytes == stat.returned_bytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0x93,"bool tcmalloc::PageHeap::CheckState()");
}

Assistant:

bool CheckState() {
        std::lock_guard<std::mutex> guard(lock);
        assert(0 <= release_rate_);
        assert(release_index_ <= 128);
        assert((stat.normal_bytes + stat.returned_bytes + stat.in_used_bytes) == stat.system_bytes);
        assert(CheckSmallList());

        uint64_t normal_bytes = 0;
        uint64_t returned_bytes = 0;
        uint64_t large_normal_bytes = 0;
        uint64_t large_returned_bytes = 0;

        for (int i = 0; i <= spanSmallPages; ++i) {
            int count = small_normal_size_[i];
            for (Span* span = small_normal_[i].next; span != &small_normal_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_NORMAL);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                normal_bytes += span->npages * spanPageSize;
            }
            count = small_returned_size_[i];
            for (Span* span = small_returned_[i].next; span != &small_returned_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_RETURNED);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                returned_bytes += span->npages * spanPageSize;
            }
        }

        int count = large_normal_.size();
        for (auto it = large_normal_.begin(); it != large_normal_.end(); ++it) {
            count--;
            assert(count >= 0);
            assert((*it)->location == Span::IN_NORMAL);
            assert(page_map_.Get((*it)->page_id) == (*it));
            assert(page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it));
            normal_bytes += (*it)->npages * spanPageSize;
            large_normal_bytes += (*it)->npages * spanPageSize;
        }
        count = large_returned_.size();
        for (auto it = large_returned_.begin(); it != large_returned_.end(); ++it) {
            count--;
            assert(count >= 0);
            assert((*it)->location == Span::IN_RETURNED);
            assert(page_map_.Get((*it)->page_id) == (*it));
            assert(page_map_.Get((*it)->page_id + (*it)->npages - 1) == (*it));
            returned_bytes += (*it)->npages * spanPageSize;
            large_returned_bytes += (*it)->npages * spanPageSize;
        }

        assert(large_normal_bytes == stat.large_normal_bytes);
        assert(large_returned_bytes == stat.large_returned_bytes);
        assert(normal_bytes == stat.normal_bytes);
        assert(returned_bytes == stat.returned_bytes);

        return true;
    }